

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.cpp
# Opt level: O0

void __thiscall cppcms::session_interface::default_expiration(session_interface *this)

{
  session_interface *in_RDI;
  string *in_stack_ffffffffffffffa8;
  allocator local_29;
  string local_28 [24];
  session_interface *in_stack_fffffffffffffff0;
  
  check(in_stack_fffffffffffffff0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"_h",&local_29);
  erase(in_RDI,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  in_RDI->how_ = in_RDI->how_def_;
  return;
}

Assistant:

void session_interface::default_expiration()
{
	check();
	erase("_h");
	how_=how_def_;
}